

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O0

void aec_get_rsi_msb_16(aec_stream *strm)

{
  uint32_t *puVar1;
  uchar *puVar2;
  int iVar3;
  int rsi;
  uchar *in;
  uint32_t *out;
  int i;
  aec_stream *strm_local;
  
  puVar1 = strm->state->data_raw;
  puVar2 = strm->next_in;
  iVar3 = strm->rsi * strm->block_size;
  for (i = 0; i < iVar3; i = i + 1) {
    puVar1[i] = (uint)CONCAT11(puVar2[i << 1],puVar2[i * 2 + 1]);
  }
  strm->next_in = strm->next_in + iVar3 * 2;
  strm->avail_in = strm->avail_in - (long)(iVar3 * 2);
  return;
}

Assistant:

void aec_get_rsi_msb_16(struct aec_stream *strm)
{
    int i;
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (i = 0; i < rsi; i++)
        out[i] = ((uint32_t)in[2 * i] << 8) | (uint32_t)in[2 * i + 1];

    strm->next_in += 2 * rsi;
    strm->avail_in -= 2 * rsi;
}